

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

string * __thiscall Chainstate::ToString_abi_cxx11_(string *__return_storage_ptr__,Chainstate *this)

{
  pointer ppCVar1;
  CBlockIndex *pCVar2;
  uint256 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  int local_64;
  char *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_60 = "ibd";
    if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged != false) {
      local_60 = "snapshot";
    }
  }
  else {
    pCVar2 = ppCVar1[-1];
    local_60 = "ibd";
    if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged != false) {
      local_60 = "snapshot";
    }
    if (pCVar2 != (CBlockIndex *)0x0) {
      local_64 = pCVar2->nHeight;
      puVar3 = pCVar2->phashBlock;
      if (puVar3 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_58 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
      uStack_50 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_48 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_40 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_(&local_30,&local_58);
      goto LAB_00402be6;
    }
  }
  local_64 = -1;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"null","");
LAB_00402be6:
  tinyformat::format<char_const*,int,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)"Chainstate [%s] @ height %d (%s)",
             (char *)&local_60,(char **)&local_64,(int *)&local_30,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Chainstate::ToString()
{
    AssertLockHeld(::cs_main);
    CBlockIndex* tip = m_chain.Tip();
    return strprintf("Chainstate [%s] @ height %d (%s)",
                     m_from_snapshot_blockhash ? "snapshot" : "ibd",
                     tip ? tip->nHeight : -1, tip ? tip->GetBlockHash().ToString() : "null");
}